

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_Mix_Generic_Scalar
               (uint32_t toMix,uint32_t srcChans,uint32_t dstChans,float *src,float *dst,
               float *coefficients)

{
  uint32_t ci;
  uint32_t co;
  uint32_t i;
  float *coefficients_local;
  float *dst_local;
  float *src_local;
  uint32_t dstChans_local;
  uint32_t srcChans_local;
  uint32_t toMix_local;
  
  dst_local = dst;
  src_local = src;
  for (i = 0; i < toMix; i = i + 1) {
    for (co = 0; co < dstChans; co = co + 1) {
      for (ci = 0; ci < srcChans; ci = ci + 1) {
        dst_local[co] = src_local[ci] * coefficients[co * srcChans + ci] + dst_local[co];
      }
    }
    src_local = src_local + srcChans;
    dst_local = dst_local + dstChans;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_Generic_Scalar(
	uint32_t toMix,
	uint32_t srcChans,
	uint32_t dstChans,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i, co, ci;
	for (i = 0; i < toMix; i += 1, src += srcChans, dst += dstChans)
	for (co = 0; co < dstChans; co += 1)
	{
		for (ci = 0; ci < srcChans; ci += 1)
		{
			dst[co] += (
				src[ci] *
				coefficients[co * srcChans + ci]
			);
		}
	}
}